

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::embeddings_gradient
               (tensor *prev,tensor *gradient_input,tensor *grads,tensor *freqs,float learning_rate,
               bool scale)

{
  uint *puVar1;
  thread_pool_implementation *this;
  task_state_type *ptVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  thread_pool *ptVar6;
  unsigned_long uVar7;
  long lVar8;
  pthread_t id;
  long lVar9;
  code *pcVar10;
  uint64 uVar11;
  ostream *poVar12;
  fatal_error *this_00;
  long lVar13;
  long *plVar14;
  long lVar15;
  long i;
  long lVar16;
  long nc;
  long nr;
  long nk;
  float *grads_data;
  float *freqs_data;
  float *gradient_input_data;
  float *prev_data;
  vector<dlib::mutex,_std::allocator<dlib::mutex>_> embedding_mutexes;
  ostringstream dlib_o_out;
  bool local_265;
  float local_264;
  long local_260;
  thread_pool *local_258;
  long local_250;
  long local_248;
  helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2567:38)>
  *local_240;
  code *local_238;
  long local_230;
  string local_228;
  long local_208;
  longlong local_200;
  longlong local_1f8;
  long local_1f0;
  float *local_1e8;
  float *local_1e0;
  float *local_1d8;
  float *local_1d0;
  helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2567:38)>
  local_1c8;
  vector<dlib::mutex,_std::allocator<dlib::mutex>_> local_1c0;
  anon_class_104_13_45b05625 local_1a8 [3];
  
  local_265 = scale;
  local_264 = learning_rate;
  if ((((((0 < prev->m_nr) && (gradient_input->m_n == prev->m_n)) &&
        (gradient_input->m_k == prev->m_k)) &&
       ((gradient_input->m_nr == prev->m_nr && (gradient_input->m_nc == grads->m_k)))) &&
      ((0 < gradient_input->m_nc && ((0 < grads->m_n && (grads->m_nr == 1)))))) &&
     (grads->m_nc == 1)) {
    iVar5 = (*prev->_vptr_tensor[2])(prev);
    local_1d0 = (float *)CONCAT44(extraout_var,iVar5);
    iVar5 = (*gradient_input->_vptr_tensor[2])(gradient_input);
    local_1d8 = (float *)CONCAT44(extraout_var_00,iVar5);
    iVar5 = (*freqs->_vptr_tensor[2])(freqs);
    local_1e0 = (float *)CONCAT44(extraout_var_01,iVar5);
    iVar5 = (*grads->_vptr_tensor[3])(grads);
    local_1e8 = (float *)CONCAT44(extraout_var_02,iVar5);
    local_1f0 = gradient_input->m_k;
    lVar15 = gradient_input->m_n;
    local_1f8 = gradient_input->m_nr;
    local_200 = gradient_input->m_nc;
    std::vector<dlib::mutex,_std::allocator<dlib::mutex>_>::vector
              (&local_1c0,grads->m_n,(allocator_type *)local_1a8);
    local_1a8[0].nk = &local_1f0;
    local_1a8[0].nr = &local_1f8;
    local_1a8[0].prev_data = &local_1d0;
    lVar15 = lVar15 * local_1f0;
    local_1a8[0].freqs_data = &local_1e0;
    local_1a8[0].scale = &local_265;
    local_1a8[0].nc = &local_200;
    local_1a8[0].gradient_input_data = &local_1d8;
    local_1a8[0].grads_data = &local_1e8;
    local_1a8[0].learning_rate = &local_264;
    local_1a8[0].prev = prev;
    local_1a8[0].grads = grads;
    local_1a8[0].embedding_mutexes = &local_1c0;
    local_1a8[0].gradient_input = gradient_input;
    ptVar6 = default_thread_pool();
    local_240 = &local_1c8;
    local_238 = impl::
                helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>
                ::run;
    local_230 = 0;
    local_1c8.funct = local_1a8;
    uVar7 = thread_pool_implementation::num_threads_in_pool
                      ((ptVar6->impl).
                       super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (uVar7 == 0) {
      if (0 < lVar15) {
        lVar9 = 0;
        do {
          impl::
          helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>
          ::run(&local_1c8,lVar9);
          lVar9 = lVar9 + 1;
        } while (lVar15 - lVar9 != 0);
      }
    }
    else {
      uVar7 = thread_pool_implementation::num_threads_in_pool
                        ((ptVar6->impl).
                         super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      lVar8 = lVar15 / (long)(uVar7 << 3);
      lVar9 = 1;
      if (1 < lVar8) {
        lVar9 = lVar8;
      }
      if (0 < lVar15) {
        lVar8 = lVar9;
        lVar16 = 0;
        local_260 = lVar9;
        local_258 = ptVar6;
        local_250 = lVar15;
        do {
          local_208 = lVar16 + lVar8;
          this = (ptVar6->impl).
                 super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
          lVar13 = lVar15;
          if (lVar9 < lVar15) {
            lVar13 = lVar9;
          }
          if (local_208 < lVar15) {
            lVar15 = local_208;
          }
          local_228._M_dataplus._M_p = (pointer)&this->m;
          local_228._M_string_length = 0;
          local_228.field_2._M_allocated_capacity = 0;
          local_248 = lVar9;
          pthread_mutex_lock((pthread_mutex_t *)local_228._M_dataplus._M_p);
          id = pthread_self();
          lVar9 = thread_pool_implementation::find_empty_task_slot(this);
          if ((lVar9 == -1) &&
             (bVar4 = thread_pool_implementation::is_worker_thread(this,id), bVar4)) {
            auto_mutex::unlock((auto_mutex *)&local_228);
            lVar9 = local_248;
            lVar15 = local_250;
            ptVar6 = local_258;
            lVar8 = local_260;
            do {
              plVar14 = (long *)((long)&local_240->funct + local_230);
              pcVar10 = local_238;
              if (((ulong)local_238 & 1) != 0) {
                pcVar10 = *(code **)(local_238 + *plVar14 + -1);
              }
              (*pcVar10)(plVar14,lVar16);
              lVar16 = lVar16 + 1;
            } while (lVar13 != lVar16);
          }
          else {
            while (lVar9 == -1) {
              pthread_cond_wait((pthread_cond_t *)&(this->task_done_signaler).cond,
                                (pthread_mutex_t *)(this->task_done_signaler).associated_mutex);
              lVar9 = thread_pool_implementation::find_empty_task_slot(this);
            }
            (this->tasks).array_elements[lVar9].thread_id = id;
            uVar11 = thread_pool_implementation::make_next_task_id(this,lVar9);
            ptVar2 = (this->tasks).array_elements;
            ptVar2[lVar9].task_id = uVar11;
            (*(code *)**ptVar2[lVar9].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data)();
            puVar3 = (undefined8 *)
                     ptVar2[lVar9].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data;
            puVar3[1] = &local_240;
            *(undefined4 *)(puVar3 + 2) = 0;
            puVar3[3] = impl::
                        helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2567:38)>_>
                        ::process_block;
            puVar3[4] = 0;
            *puVar3 = &PTR__mp_base_base_001fa770;
            ptVar2 = (this->tasks).array_elements;
            ptVar2[lVar9].arg1 = lVar16;
            ptVar2[lVar9].arg2 = lVar15;
            pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
            lVar9 = local_248;
            lVar15 = local_250;
            lVar8 = local_260;
            ptVar6 = local_258;
          }
          auto_mutex::unlock((auto_mutex *)&local_228);
          lVar9 = lVar9 + lVar8;
          lVar16 = local_208;
        } while (local_208 < lVar15);
      }
      thread_pool_implementation::wait_for_all_tasks
                ((ptVar6->impl).
                 super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    std::vector<dlib::mutex,_std::allocator<dlib::mutex>_>::~vector(&local_1c0);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n\nError detected at line ",0x19);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x9fd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in file ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
             ,0x77);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Error detected in function ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "void dlib::cpu::embeddings_gradient(const tensor &, const tensor &, tensor &, const tensor &, float, bool)"
             ,0x6a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Failing expression was ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "prev.nr() > 0 && gradient_input.num_samples() == prev.num_samples() && gradient_input.k() == prev.k() && gradient_input.nr() == prev.nr() && gradient_input.nc() == grads.k() && grads.num_samples() > 0 && grads.k() > 0 && grads.nr() == 1 && grads.nc() == 1"
             ,0xff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".\n",2);
  puVar1 = (uint *)((long)&local_1a8[0].prev + local_1a8[0].nk[-3]);
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\ngradient_input.num_samples(): ",0x1f);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ngradient_input.k(): ",0x15);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ngradient_input.nr(): ",0x16);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ngradient_input.nc(): ",0x16);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\nprev.num_samples(): ",0x15);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\nprev.k(): ",0xb);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\nprev.nr(): ",0xc);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\nprev.nc(): ",0xc);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ngrads.num_samples(): ",0x16);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ngrads.k(): ",0xc);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ngrads.nr(): ",0xd);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\ngrads.nc(): ",0xd);
  poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_228);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

void embeddings_gradient(
            const tensor& prev,
            const tensor& gradient_input,
            tensor& grads,
            const tensor& freqs,
            float learning_rate,
            bool scale
        )
        {
            DLIB_CASSERT(
                prev.nr() > 0 &&
                gradient_input.num_samples() == prev.num_samples() &&
                gradient_input.k() == prev.k() &&
                gradient_input.nr() == prev.nr() &&
                gradient_input.nc() == grads.k() &&
                grads.num_samples() > 0 &&
                grads.k() > 0 &&
                grads.nr() == 1 &&
                grads.nc() == 1,
                "\ngradient_input.num_samples(): " << gradient_input.num_samples() <<
                "\ngradient_input.k(): " << gradient_input.k() <<
                "\ngradient_input.nr(): " << gradient_input.nr() <<
                "\ngradient_input.nc(): " << gradient_input.nc() <<
                "\nprev.num_samples(): " << prev.num_samples() <<
                "\nprev.k(): " << prev.k() <<
                "\nprev.nr(): " << prev.nr() <<
                "\nprev.nc(): " << prev.nc() <<
                "\ngrads.num_samples(): " << grads.num_samples() <<
                "\ngrads.k(): " << grads.k() <<
                "\ngrads.nr(): " << grads.nr() <<
                "\ngrads.nc(): " << grads.nc()
            );

            const float* prev_data = prev.host();
            const float* gradient_input_data = gradient_input.host();
            const float* freqs_data = freqs.host();
            float* grads_data = grads.host();
            long ns = gradient_input.num_samples(), nk = gradient_input.k();
            long nr = gradient_input.nr(), nc = gradient_input.nc();

            std::vector<dlib::mutex> embedding_mutexes(grads.num_samples());
            parallel_for(0, ns * nk, [&](long i)
                {
                    long s = i / nk;
                    long k = i % nk;

                    for (long r = 0; r < nr; ++r)
                    {
                        const unsigned long token_idx = static_cast<unsigned long>(prev_data[tensor_index(prev, s, k, r, 0)]);
                        if (token_idx < grads.num_samples())
                        {
                            const float freg_token = freqs_data[token_idx];
                            float freq_scale = 1.0f;

                            if (scale && freg_token != 0.0f) freq_scale = std::min(0.15f, std::max(1.0f / freg_token, 1.0f));
                            auto_mutex locker(embedding_mutexes[token_idx]);
                            for (long c = 0; c < nc; ++c)
                            {
                                const float gradient = gradient_input_data[tensor_index(gradient_input, s, k, r, c)];
                                grads_data[tensor_index(grads, token_idx, c, 0, 0)] -= (gradient * learning_rate * freq_scale);
                            }
                        }
                    }
                });
        }